

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O0

REF_STATUS ref_cell_deep_copy(REF_CELL *ref_cell_ptr,REF_CELL original)

{
  int iVar1;
  REF_CELL pRVar2;
  REF_INT *pRVar3;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_CELL ref_cell;
  int local_28;
  REF_INT max;
  REF_INT cell;
  REF_INT node;
  REF_CELL original_local;
  REF_CELL *ref_cell_ptr_local;
  
  pRVar2 = (REF_CELL)malloc(0x48);
  *ref_cell_ptr = pRVar2;
  if (*ref_cell_ptr == (REF_CELL)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x1e4,
           "ref_cell_deep_copy","malloc *ref_cell_ptr of REF_CELL_STRUCT NULL");
    ref_cell_ptr_local._4_4_ = 2;
  }
  else {
    pRVar2 = *ref_cell_ptr;
    ref_cell_ptr_local._4_4_ = ref_cell_initialize(pRVar2,original->type);
    if (ref_cell_ptr_local._4_4_ == 0) {
      iVar1 = original->max;
      pRVar2->n = original->n;
      pRVar2->max = iVar1;
      if (pRVar2->max * pRVar2->size_per < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
               0x1ef,"ref_cell_deep_copy","malloc ref_cell->c2n of REF_INT negative");
        ref_cell_ptr_local._4_4_ = 1;
      }
      else {
        pRVar3 = (REF_INT *)malloc((long)(pRVar2->max * pRVar2->size_per) << 2);
        pRVar2->c2n = pRVar3;
        if (pRVar2->c2n == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                 0x1ef,"ref_cell_deep_copy","malloc ref_cell->c2n of REF_INT NULL");
          ref_cell_ptr_local._4_4_ = 2;
        }
        else {
          for (local_28 = 0; local_28 < iVar1; local_28 = local_28 + 1) {
            for (max = 0; max < pRVar2->size_per; max = max + 1) {
              pRVar2->c2n[max + pRVar2->size_per * local_28] =
                   original->c2n[max + original->size_per * local_28];
            }
          }
          pRVar2->blank = original->blank;
          ref_cell_ptr_local._4_4_ = ref_adj_deep_copy(&pRVar2->ref_adj,original->ref_adj);
          if (ref_cell_ptr_local._4_4_ == 0) {
            ref_cell_ptr_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                   0x1f7,"ref_cell_deep_copy",(ulong)ref_cell_ptr_local._4_4_,
                   "deep copy ref_adj for ref_cell");
          }
        }
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x1e8,
             "ref_cell_deep_copy",(ulong)ref_cell_ptr_local._4_4_,"init");
    }
  }
  return ref_cell_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_cell_deep_copy(REF_CELL *ref_cell_ptr,
                                      REF_CELL original) {
  REF_INT node, cell;
  REF_INT max;
  REF_CELL ref_cell;
  ref_malloc(*ref_cell_ptr, 1, REF_CELL_STRUCT);

  ref_cell = (*ref_cell_ptr);

  RSS(ref_cell_initialize(ref_cell, ref_cell_type(original)), "init");

  max = ref_cell_max(original);
  ref_cell_n(ref_cell) = ref_cell_n(original);
  ref_cell_max(ref_cell) = max;

  ref_malloc(ref_cell->c2n,
             ref_cell_max(ref_cell) * ref_cell_size_per(ref_cell), REF_INT);
  for (cell = 0; cell < max; cell++)
    for (node = 0; node < ref_cell_size_per(ref_cell); node++)
      ref_cell_c2n(ref_cell, node, cell) = ref_cell_c2n(original, node, cell);

  ref_cell_blank(ref_cell) = ref_cell_blank(original);

  RSS(ref_adj_deep_copy(&(ref_cell->ref_adj), original->ref_adj),
      "deep copy ref_adj for ref_cell");

  return REF_SUCCESS;
}